

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1P3L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SrcEvaluatorType srcEvaluator_1;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar7;
  ostream *poVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float local_1af8;
  float fStack_1af4;
  float local_1ae8;
  float fStack_1ae4;
  float local_1ab8;
  float fStack_1ab4;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a74;
  float local_1a68;
  float fStack_1a64;
  float local_1a18;
  float fStack_1a14;
  float local_19a8;
  float local_1968;
  float fStack_1964;
  float local_1418;
  Scalar local_13cc;
  Scalar local_13c8;
  Scalar local_13c4;
  Scalar local_13c0;
  Scalar local_13bc;
  Scalar local_13b8;
  Scalar local_13b4;
  Scalar local_13b0;
  Scalar local_13ac;
  Scalar local_13a8;
  float local_13a4;
  float b;
  float local_139c;
  float ty;
  float tx;
  Matrix<float,_6,_1,_0,_6,_1> v3;
  Matrix<float,_3,_1,_0,_3,_1> D1;
  float fStack_1164;
  float local_1158;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_6,_1,_0,_6,_1> u3;
  Matrix<float,_6,_6,_0,_6,_6> TL;
  float local_e38;
  float local_d88;
  Matrix<float,_4,_4,_0,_4,_4> transOut;
  Matrix<float,_6,_1,_0,_6,_1> v2;
  Matrix<float,_6,_6,_0,_6,_6> TK;
  undefined1 local_af8 [88];
  Matrix<float,_6,_1,_0,_6,_1> u1;
  Matrix<float,_4,_1,_0,_4,_1> Q32;
  Matrix<float,_4,_1,_0,_4,_1> Q31;
  Matrix<float,_4,_1,_0,_4,_1> P32;
  Matrix<float,_4,_1,_0,_4,_1> P31;
  Matrix<float,_4,_1,_0,_4,_1> Q22;
  Matrix<float,_4,_1,_0,_4,_1> Q21;
  Matrix<float,_4,_1,_0,_4,_1> P22;
  Matrix<float,_4,_1,_0,_4,_1> P21;
  Matrix<float,_6,_1,_0,_6,_1> u2;
  Matrix<float,_6,_1,_0,_6,_1> v1;
  Matrix<float,_3,_1,_0,_3,_1> local_814;
  Matrix<float,_3,_1,_0,_3,_1> local_808;
  Matrix<float,_3,_1,_0,_3,_1> tQ32;
  Matrix<float,_3,_1,_0,_3,_1> tQ31;
  Matrix<float,_3,_1,_0,_3,_1> tP32;
  Matrix<float,_3,_1,_0,_3,_1> tP31;
  Matrix<float,_3,_1,_0,_3,_1> tQ22;
  Matrix<float,_3,_1,_0,_3,_1> tQ21;
  Matrix<float,_3,_1,_0,_3,_1> tP22;
  Matrix<float,_3,_1,_0,_3,_1> tP21;
  Matrix<float,_3,_1,_0,_3,_1> tQ12;
  Matrix<float,_3,_1,_0,_3,_1> tQ11;
  Matrix<float,_3,_1,_0,_3,_1> tP11;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  Matrix<float,_4,_1,_0,_4,_1> Q12;
  Matrix<float,_4,_1,_0,_4,_1> Q11;
  Matrix<float,_4,_1,_0,_4,_1> P12;
  Matrix<float,_4,_1,_0,_4,_1> P11;
  _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_128;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  Matrix<float,_3,_1,_0,_3,_1> tP12;
  Matrix<float,_4,_1,_0,_4,_1> local_88;
  Matrix<float,_4,_1,_0,_4,_1> local_78;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  Matrix<float,_6,_1,_0,_6,_1> L32;
  
  pfVar1 = *(float **)plPair;
  if ((*(float **)(plPair + 8) != pfVar1) &&
     (pfVar2 = *(float **)lPair, 0x80 < (ulong)(*(long *)(lPair + 8) - (long)pfVar2))) {
    uVar3 = *(undefined8 *)pfVar1;
    uVar4 = *(undefined8 *)(pfVar1 + 2);
    uVar5 = *(undefined8 *)(pfVar1 + 4);
    uVar6 = *(undefined8 *)(pfVar1 + 6);
    P11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)pfVar2;
    P11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 2);
    P12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 4);
    P12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 6);
    Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 8);
    Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 10);
    Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0xc);
    Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0xe);
    P21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x10);
    P21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x12);
    P22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x14);
    P22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x16);
    Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x18);
    Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x1a);
    Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x1c);
    Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x1e);
    P31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x20);
    P31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x22);
    P32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x24);
    P32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x26);
    Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x28);
    Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x2a);
    Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)(pfVar2 + 0x2c);
    Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)(pfVar2 + 0x2e);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q11,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q11.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ11,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q12,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q12.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ12,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q21,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q21.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ21,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q22,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q22.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ22,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&P32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               P32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tP32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q31,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q31.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ31,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)&TK,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&Q32,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                *)&TL,(MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&TK,
               Q32.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array + 3);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,4,1>const>const>>
              (&tQ32,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>_>
                      *)&TL);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tP11;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tP12;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tP22;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tP21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tP32;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tP31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tP31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tP32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tQ12;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tQ11;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tQ22;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tQ21;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,(Scalar *)&TK);
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
         &tQ32;
    TL.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
         &tQ31;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
              (&D1,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,&D1);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         * tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2] *
                 tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
         tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [2] - tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[2];
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
         tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         * tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
           [1] - tQ31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 tQ32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[1];
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>,Eigen::Matrix<float,3,1,0,3,1>>
              ((Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false> *)&TL,
               (Matrix<float,_3,_1,_0,_3,_1> *)&TK);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)&TL,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,3);
    TK.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
         Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                   ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
                    &TL);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,(Scalar *)&TK);
    local_88.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _0_8_ = uVar5;
    local_88.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _8_8_ = uVar6;
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _0_8_ = uVar3;
    local_78.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array.
    _8_8_ = uVar4;
    getPredefinedTransformations1Plane3Line<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_128,&local_78,&local_88,false);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_128._M_impl.super__Vector_impl_data._M_finish[-1].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-1].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
         *(undefined8 *)
          local_128._M_impl.super__Vector_impl_data._M_finish[-2].
          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._16_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._24_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._32_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 8);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._40_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 10);
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._48_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc)
    ;
    TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
         *(undefined8 *)
          (local_128._M_impl.super__Vector_impl_data._M_finish[-2].
           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xe)
    ;
    local_128._M_impl.super__Vector_impl_data._M_finish =
         local_128._M_impl.super__Vector_impl_data._M_finish + -2;
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Zero
              ((ConstantReturnType *)&transOut,6,6);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,6,0,6,6>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (&TL,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                    *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)local_af8,&TL,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_af8,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TU,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)local_af8,&TL,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_af8,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&u2,
                    &TU,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&transOut,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&u2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_808,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&transOut);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&v2,&local_808);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)&u3,(int *)&v3,(StorageBaseType *)&v2);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&u1,&TU,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_af8,(Lhs *)&u3,(Rhs *)&u1);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>((Type *)&v1,&TL,3,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&v1,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_af8);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Zero
              ((ConstantReturnType *)&transOut,6,6);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,6,0,6,6>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (&TK,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                    *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              ((Type *)local_af8,&TK,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_af8,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)&transOut,&TV,3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomRightCorner<int,int>
              ((Type *)local_af8,&TK,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)local_af8,
               (Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&transOut);
    v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = -NAN;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true,_true> *)&u2,
                    &TV,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_>::head<int>
              ((Type *)&transOut,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>_> *)&u2,3);
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,4,1,true>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_814,
               (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
                *)&transOut);
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&v2,&local_814);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)&u3,(int *)&v3,(StorageBaseType *)&v2);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>((Type *)&u1,&TV,3,3);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
               *)local_af8,(Lhs *)&u3,(Rhs *)&u1);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::bottomLeftCorner<int,int>((Type *)&v1,&TK,3,3)
    ;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>const,Eigen::Matrix<float,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,0>>
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&v1,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
                *)local_af8);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = &L11;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&u1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = &L12;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TK;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&v1,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = &L21;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&u2,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = &L22;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TK;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&v2,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = &L31;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TL;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&u3,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _0_8_ = &TK;
    transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array.
    _8_8_ = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,6,1,0,6,1>,Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (&v3,(Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                    *)&transOut);
    fVar61 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    local_1ab8 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0];
    fStack_1ab4 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1];
    local_1a18 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3];
    fStack_1a14 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4];
    fVar230 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] + u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0];
    fVar11 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] + u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    local_1af8 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[2];
    fStack_1af4 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3];
    local_1968 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    fStack_1964 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    fVar231 = local_1968 *
              u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar261 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar11;
    fVar137 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * fStack_1a14;
    fVar179 = fVar11 * fStack_1a14;
    local_1ae8 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    fStack_1ae4 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    local_1a98 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[1];
    fStack_1a94 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2];
    fVar62 = local_1ae8 * fVar137 * local_1af8 * local_1a98;
    fVar12 = -(fVar179 * local_1af8) * local_1ae8 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar13 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fStack_1ab4 * local_1ae8 * fStack_1a94;
    fVar190 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] + u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3];
    local_19a8 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] *
                  u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]);
    fVar14 = fVar190 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * fStack_1ab4 * local_1ae8 * fStack_1a94;
    local_1158 = -fVar13;
    fVar232 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1968;
    fVar262 = fVar190 * fStack_1964;
    fVar63 = fStack_1ae4 * fVar232 * local_1af8;
    fVar118 = local_1ae8 * fVar262 * local_1af8;
    local_1a68 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4];
    fStack_1a64 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5];
    fVar15 = local_1a68 * fVar63;
    fVar63 = fStack_1a94 * fVar63;
    fVar302 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar118;
    fVar339 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * 2.0;
    fVar344 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * 4.0;
    fVar16 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] + u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1];
    fVar340 = fVar339 * fStack_1964;
    fVar345 = fVar344 * local_1968;
    fVar191 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[2];
    fVar17 = fVar191 * local_1af8;
    fVar49 = local_1968 * fVar16 * local_1af8;
    fVar233 = -fVar231;
    fStack_1a74 = -fVar261;
    fVar371 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * fStack_1964;
    fVar378 = fVar16 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0];
    fVar192 = fVar11 * fStack_1964;
    fVar316 = fVar233 * local_1ab8;
    fVar347 = local_1ae8 * fVar316 * local_1a68;
    fVar354 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1af4 * fVar192 * local_1a98;
    fVar317 = fVar231 * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar138 = local_1a68 * fVar317;
    fVar180 = local_1a98 *
              -(fVar192 *
               u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4]) * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0];
    fVar50 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fStack_1964;
    fVar18 = fStack_1ae4 * -fVar50 * fStack_1ab4;
    fVar64 = fStack_1a64 * fVar18;
    fVar119 = fStack_1a94 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -(fVar339 *
                     u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[0]) * fStack_1ab4;
    fVar303 = fVar261 * fStack_1ab4;
    fVar313 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar303;
    fVar139 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * local_1ae8 * fVar303;
    fVar19 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] + u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5];
    fVar65 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] * fStack_1964;
    fVar291 = local_1ab8 * fVar65;
    fVar356 = fVar11 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[5];
    fVar140 = local_1af8 * fVar65;
    fVar234 = -(fVar192 * local_1ab8);
    fVar51 = fVar192 * local_1ab8 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar235 = local_1a98 *
              fVar140 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar141 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * 4.0;
    fVar142 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * 4.0;
    fVar143 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * 4.0;
    fVar332 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[4] * 4.0);
    local_1418 = -(fVar140 *
                  v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]);
    fVar218 = fVar230 * fStack_1964;
    fVar66 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5];
    fVar120 = fVar16 * fStack_1964;
    fVar67 = fVar120 * local_1ab8;
    fVar193 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2] * local_1a18;
    fVar194 = fVar193 * local_1af8 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar236 = fVar120 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    fVar318 = local_1a98 * fVar236;
    fVar219 = fVar339 * local_1968 * local_1af8;
    fVar273 = fStack_1ae4 *
              fVar120 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    fVar20 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] * local_1968 * local_1af8 * fStack_1ae4 * fStack_1a94;
    fVar21 = local_1ae8 * fVar192 * fStack_1ab4;
    fVar308 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar21;
    fVar21 = fVar21 * fStack_1a64;
    fVar52 = local_1968 * fVar16 * local_1ab8;
    fVar68 = fVar141 * local_1968 * local_1af8;
    fVar69 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * -fVar52 * fStack_1ae4;
    fVar144 = local_1a18 * fVar11;
    fVar11 = local_1968 * fVar11;
    fVar195 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0] * fStack_1ab4;
    fVar22 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * fStack_1964;
    fVar23 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fStack_1964;
    fVar341 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fStack_1964;
    fVar274 = fVar230 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1ab4;
    fVar145 = fVar230 * local_1968;
    fVar70 = fVar218 * fStack_1ab4;
    fVar24 = fVar141 * fStack_1964;
    fVar348 = fVar142 * fStack_1964;
    fVar71 = fVar344 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0];
    fVar237 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * 4.0 * fStack_1964;
    fVar372 = fVar65 * fStack_1ab4;
    fVar357 = -(fVar19 * fStack_1964);
    fVar238 = fStack_1ab4 * -fVar24;
    fVar25 = fVar230 * local_1a18 * local_1af8 * fStack_1ae4;
    fVar342 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar25;
    fVar369 = fVar120 * fStack_1af4 * fStack_1ae4;
    fVar338 = local_1af8 *
              u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -fVar142;
    fVar196 = local_1ae8 * local_1ab8 * fVar144;
    fVar309 = local_1a98 * fVar196;
    fVar197 = fVar142 * local_1968 * local_1af8;
    fVar326 = fVar190 * local_1968 * local_1af8;
    fVar72 = fVar16 * local_1a18 * local_1af8 * fStack_1ae4;
    fVar121 = fVar16 * fStack_1a14 * local_1af8 * fStack_1ae4;
    fVar26 = local_1a98 * fVar72;
    fVar72 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar72;
    fVar53 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar121;
    fVar319 = local_1ae8 * fVar340 * local_1ab8;
    fVar220 = fVar345 * fStack_1ab4 * local_1ae8;
    fVar27 = local_1a98 *
             fVar340 * local_1ab8 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fStack_1164 = -fVar319;
    fVar221 = fVar261 * local_1af8;
    fVar320 = local_1ab8 *
              u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * local_1968;
    fVar327 = local_1ab8 * fVar11;
    fVar198 = local_1a68 * fStack_1ae4 * fVar320;
    fVar222 = local_1a68 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar327;
    fVar239 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar262 * local_1ab8;
    fVar263 = fVar190 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * local_1af8;
    fVar365 = local_1af8 * fVar340 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar364 = local_1ae8 * fVar11 * fStack_1ab4;
    fVar321 = fVar340 * fStack_1ab4 * local_1ae8;
    fVar199 = fVar192 * local_1af8;
    fVar330 = -(fVar192 * fStack_1ab4);
    fVar73 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * local_1ab8 * fVar357 * fStack_1ae4;
    fVar54 = fVar19 * fStack_1964 * local_1af8 * fStack_1ae4;
    fVar74 = fStack_1a94 * fVar19 * local_1968 * local_1af8 * fStack_1ae4;
    fVar75 = fVar230 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * local_1af8;
    fVar146 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fStack_1ae4 * fVar75;
    fVar200 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar75 * fStack_1a94;
    fVar76 = fVar146 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0];
    fVar201 = fVar200 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar77 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar65 * fStack_1af4 * local_1a98;
    fVar147 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar67 * local_1a98;
    fVar78 = -fVar22 * fStack_1ab4 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    fVar148 = local_1ae8 * fVar261 * local_1ab8;
    fVar181 = fStack_1ae4 * fVar232 * fStack_1ab4;
    fVar122 = local_1a68 * fVar181;
    fVar149 = fVar71 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar79 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fVar320 * fStack_1a94;
    fVar292 = fVar327 * local_1ae8;
    fVar275 = fVar11 * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar264 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar179 * fStack_1ab4;
    fVar80 = local_1a98 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar137 * fStack_1ab4;
    fVar123 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar264;
    fVar150 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar67 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4];
    fVar81 = local_1ae8 * local_19a8 * local_1af8 * fStack_1a94;
    fVar124 = local_1ae8 * fVar263 * fStack_1a94;
    fVar182 = fVar120 * fStack_1ab4;
    fVar320 = local_1a98 *
              fVar182 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    fVar28 = fVar23 * local_1af8 * local_1ae8;
    fVar240 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar28;
    fVar82 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar262 * fStack_1ab4;
    fVar241 = local_1a98 * fVar82;
    local_d88 = -fVar240;
    fVar29 = local_1af8 * -fVar61;
    fVar83 = fStack_1ae4 * fVar29;
    fVar30 = fStack_1a94 * fVar83;
    fVar202 = fStack_1ae4 *
              fVar232 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * fStack_1a94;
    fVar304 = fVar378 * local_1ab8 * fStack_1ae4;
    fVar31 = fStack_1a94 * fVar61 * fStack_1af4 * fStack_1ae4;
    fVar55 = local_1a68 * fVar304;
    fVar366 = fStack_1ab4 * fVar191;
    fVar84 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[5]) * fStack_1ab4 * fStack_1ae4 * fStack_1a94;
    fVar125 = fVar219 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1a94;
    fVar83 = fVar83 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3];
    fVar314 = -fVar304 * fStack_1a94;
    fVar85 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar366 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3];
    fVar126 = fStack_1ae4 * -fVar378 * fStack_1af4 * fStack_1a94;
    fVar86 = fVar17 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3];
    fVar127 = fVar378 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * fStack_1ae4 * fStack_1a94;
    fVar305 = fStack_1a94 *
              fVar263 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar263 = fStack_1a94 * fVar275;
    fVar242 = local_1ab8 * -fVar345;
    fVar183 = local_1af8 * fVar11;
    fVar181 = fStack_1a94 * fVar181;
    fVar243 = -(fStack_1a94 * fVar148);
    fVar304 = fStack_1ae4 * fVar61 * fStack_1ab4 * fStack_1a94;
    fVar32 = fVar145 * local_1af8;
    fVar151 = fStack_1ae4 * fVar32;
    fVar33 = fStack_1ae4 * fVar232 * local_1ab8 * fStack_1a94;
    fVar343 = fVar218 * local_1ab8;
    fVar152 = fStack_1ae4 * fVar343 * local_1a98;
    fVar203 = fStack_1ae4 * fVar70;
    fVar244 = fStack_1af4 * fVar233 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar265 = fVar49 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3] * fStack_1a94;
    fVar322 = -fVar317 * fStack_1a94;
    fVar328 = -(fStack_1af4 * fVar192) * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar18 = fVar18 * local_1a98;
    fVar56 = local_1ae8 * fVar303 * fStack_1a94;
    fVar349 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar144 * fStack_1ab4;
    fVar317 = -(fVar144 * local_1af8) *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1a98;
    fVar310 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar372 * local_1a98;
    fVar315 = fVar144 * fStack_1ab4 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar34 = local_1ae8 * fVar372 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar35 = fVar366 * local_1ae8 * fStack_1a94;
    fVar57 = fVar330 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * local_1a98;
    fVar245 = fStack_1ae4 * fVar371 * fStack_1ab4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar266 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar183 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    fVar373 = fStack_1ae4 * fVar145 * local_1ab8 * fStack_1a94 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    fVar153 = fVar152 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4];
    fVar36 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * fStack_1ae4 * fVar49;
    fVar246 = fStack_1ae4 * fVar49 * local_1a68;
    fVar366 = fVar366 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1a94;
    fVar37 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] * -0.0 * local_1ae8 * fStack_1a94;
    local_e38 = -fVar37;
    fVar38 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] * fVar291 * local_1a98;
    fVar58 = fStack_1a94 * fVar364;
    fVar87 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fStack_1ae4 * fVar343 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3];
    fVar39 = fStack_1ae4 * fVar371 * local_1ab8;
    fVar346 = fVar339 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * local_1af8;
    fVar128 = fVar378 * local_1af8;
    fVar247 = fStack_1af4 * fVar371 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar267 = -(fVar378 * fStack_1ab4) *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fStack_1a94;
    fVar154 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar39;
    fVar184 = fStack_1a94 * fStack_1ae4 * fVar378 * fStack_1ab4;
    fVar374 = fVar371 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    fVar88 = fStack_1a94 * -fVar183 * local_1ae8;
    fVar319 = fVar319 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar248 = -(fVar371 * fStack_1ab4) *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0];
    fVar268 = -fVar183 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    fVar155 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar374;
    fVar374 = fVar374 * local_1a98;
    fVar379 = fVar11 * fStack_1af4 * local_1ae8 * fStack_1a94;
    fVar293 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0] * local_1af8;
    fVar40 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * local_1968 * local_1af8;
    fVar249 = fVar231 * local_1af8;
    fVar250 = fVar141 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * local_1af8;
    fVar41 = fVar50 * local_1af8 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3];
    fVar59 = fVar218 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * fStack_1ae4;
    fVar223 = fVar218 * fStack_1af4 * fStack_1ae4;
    fVar89 = fVar65 * fStack_1af4 * local_1ae8 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar90 = -(fVar66 * local_1af8) *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fStack_1a94;
    fVar129 = fVar120 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1ae4 * local_1a98;
    fVar91 = -(fVar190 * local_1968) * local_1ab8 * local_1ae8 * fStack_1a94;
    fVar276 = local_1a68 *
              -fVar221 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar92 = -fVar221 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fStack_1a94;
    fVar323 = fStack_1a94 *
              fVar232 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    fVar329 = local_1a98 *
              fVar70 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3];
    fVar204 = fVar145 * fStack_1ab4 * fStack_1ae4;
    fVar358 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar32 * fStack_1a94;
    fVar333 = fVar261 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar130 = fVar369 * local_1a98;
    fVar93 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fVar371 * local_1ab8 * local_1a98;
    fVar94 = fStack_1ae4 * fVar195 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
    fVar367 = fVar195 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] * fStack_1a94 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar294 = fStack_1ae4 * fVar293 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[1];
    fVar375 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3] * fVar343 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar156 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * -fVar50 * fStack_1ab4 *
                    v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3];
    fVar185 = local_1a98 * fVar223;
    fVar251 = fVar223 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar252 = fVar342 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar190 = fStack_1a94 * fVar333 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3];
    fVar334 = fVar333 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar205 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar261 * fStack_1af4 * fStack_1a94 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar331 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1ab8 * fVar144 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[2];
    fVar324 = fVar305 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar195 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar239 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar223 = -fVar274 * fStack_1ae4 * local_1a68 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar350 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fVar274 * fStack_1a94 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar274 = fStack_1ae4 * fVar75 * local_1a68 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1];
    fVar75 = fVar75 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4] * fStack_1a94 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1];
    fVar333 = -(fVar145 * local_1ab8) *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fStack_1a94 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar42 = -fVar204 * fStack_1a94 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3];
    fVar204 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar204 *
              v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [2];
    fVar43 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [3] * fVar151 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1];
    fVar44 = local_1a68 * fVar151 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar359 = fVar358 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1];
    fVar32 = fVar32 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[4] * fStack_1a94 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar45 = fVar145 * fStack_1af4 * fStack_1ae4 * fStack_1a94 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1];
    fVar46 = -fVar145 *
             u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fStack_1ae4 * fStack_1a94 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar157 = -fVar293 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fStack_1a94;
    fVar158 = fVar343 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * local_1a98;
    fVar159 = fVar232 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fStack_1a94;
    fVar95 = local_1a98 * fVar203;
    fVar96 = fVar232 * fStack_1af4 * fStack_1ae4 * fStack_1a94;
    fVar160 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fVar70 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar295 = fStack_1ae4 * fVar371 * local_1af8;
    fVar306 = fStack_1ae4 * fVar218 * local_1af8;
    fVar224 = fVar218 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4];
    fVar293 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar137 * local_1af8 * local_1a98;
    fVar60 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar179 * local_1af8 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar253 = local_1a98 * -(fVar50 * local_1ab8) * fStack_1ae4;
    fVar269 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar224;
    fVar121 = fVar121 * local_1a98;
    fVar161 = fVar357 * fStack_1ab4 * fStack_1ae4 * local_1a98;
    fVar368 = fStack_1af4 * -fVar50 * fStack_1ae4 * local_1a98;
    fVar370 = fStack_1ab4 * -(fVar230 * local_1a18) * fStack_1ae4 * local_1a98;
    fVar162 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar50 * local_1ab8 * local_1a98;
    fVar186 = -fVar224 * local_1a98;
    fVar296 = -fVar236 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar163 = fVar234 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar97 = local_1af8 *
             u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * local_1a18 * fStack_1ae4 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar131 = fStack_1ab4 * fVar230 * fStack_1a14 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar277 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar41;
    fVar286 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar59;
    fVar41 = local_1a98 * fVar41;
    fVar59 = fVar59 * local_1a98;
    fVar25 = fVar25 * local_1a98;
    fVar224 = -fVar51 * fStack_1ab4 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar278 = local_1ab8 *
              u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] * fStack_1ae4 * fStack_1a94;
    fVar287 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar218 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar279 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0] * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar369 = fVar369 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar218 = local_1af8 *
              -fVar230 *
              u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fStack_1ae4 * fStack_1a94;
    fVar297 = fVar61 * local_1ab8 * fStack_1ae4;
    fVar307 = fVar230 * fStack_1a14 * local_1af8 * fStack_1ae4;
    fVar164 = fStack_1a94 * fVar297;
    fVar187 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar307;
    fVar297 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar297;
    fVar307 = fVar307 * local_1a98;
    fVar98 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * local_1a18 * local_1ab8 * fStack_1ae4 *
             v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0];
    fVar206 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar372 * fStack_1a64;
    fVar364 = fVar364 * local_1a68;
    fVar270 = fStack_1ae4 * fVar128;
    fVar236 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1ae4 *
                    -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] * local_1a18) * local_1af8;
    fVar360 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar270;
    fVar99 = fVar191 * local_1ab8 * local_1ae8;
    fVar280 = fStack_1a94 * fVar99;
    fVar357 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar128 * fStack_1a94;
    fVar254 = -fVar99 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3];
    fVar100 = fVar128 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * fStack_1a94;
    fVar101 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * local_1ae8 * fVar17;
    fVar207 = fVar191 * fStack_1af4 * local_1ae8 * fStack_1a94;
    fVar225 = fVar52 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[3] * fStack_1a94;
    fVar311 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar316 * fStack_1a94;
    fVar355 = fVar67 * fStack_1ae4;
    fVar165 = local_1a98 *
              fVar291 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0];
    fVar312 = fVar22 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar208 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar312;
    fVar312 = fVar312 * local_1a98;
    fVar325 = fVar22 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1a98;
    fVar226 = -(v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * fVar355);
    fVar102 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1ae8 * fVar291;
    fVar166 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] * local_1af8 * fStack_1ae4 * fStack_1a94;
    fVar255 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * local_1ae8 * -fVar193 * local_1ab8;
    fVar271 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1ae4 * fVar182;
    fVar167 = -fVar271;
    fVar209 = fVar193 * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0];
    fVar281 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * fVar182 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar103 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar193 * local_1af8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar132 = -fVar369;
    fVar210 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] *
               u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0]) * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar256 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * local_1968 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar168 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar273;
    fVar169 = -fVar168;
    fVar170 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [3] * local_1968 * local_1af8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar211 = fVar16 * local_1a18 * local_1ab8 * fStack_1ae4 * local_1a98;
    fVar257 = -(fVar16 * fStack_1a14) * local_1ab8 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar171 = -fVar56;
    fVar172 = -fVar50 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * fStack_1ae4 * local_1a98;
    fVar104 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a14 * fStack_1ab4 * fStack_1ae4 * local_1a98;
    fVar173 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a14 * local_1af8 * fStack_1ae4 * local_1a98;
    fVar282 = local_1ae8 * fVar221 * local_1a68;
    fVar298 = fVar261 * fStack_1af4 * local_1ae8 * fStack_1a94;
    fVar258 = -fVar298;
    fVar105 = fVar61 * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fStack_1a94;
    fVar22 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar261 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] * fStack_1a94;
    fVar174 = fVar61 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * fStack_1ae4 * fStack_1a94;
    fVar188 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar327 * fStack_1a94;
    fVar175 = fVar29 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * fStack_1a94;
    fVar335 = fVar261 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * local_1ae8 * fStack_1a94;
    fVar336 = -fVar335;
    fVar380 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar11 * fStack_1af4 * fStack_1a94;
    fVar261 = -fVar40 * fStack_1ae4 * local_1a68;
    fVar106 = local_1a98 * fVar349;
    fVar283 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fVar40 * fStack_1a94;
    fVar107 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * local_1968 * local_1af8 * local_1ae8 * fStack_1a94;
    fVar108 = fVar326 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1a94;
    fVar109 = -fVar108;
    fVar259 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[4] * fVar11 * fStack_1a94;
    fVar351 = fVar371 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar29 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [1] * fStack_1a14 * local_1ab8 * fStack_1ae4 * local_1a98;
    fVar40 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * fStack_1a14) * local_1af8 * fStack_1ae4 * local_1a98;
    fVar110 = fVar191 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] * local_1ae8 * fStack_1a94;
    fVar352 = local_1ae8 *
              fVar192 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[4] *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar284 = local_1a68 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar249;
    fVar111 = local_1ae8 * fVar249 * local_1a68;
    fVar353 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * local_1968 * local_1ab8 * local_1ae8 * fStack_1a94;
    fVar361 = -fVar23 * fStack_1ab4 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar376 = fVar262 * local_1ab8 * local_1ae8 * local_1a98;
    fVar176 = -fVar61 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1ae4 * fStack_1a94;
    fVar337 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar340 * fStack_1ab4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar299 = -(u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] * fVar65) * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar300 = -(u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[5] * local_1968) * local_1ab8 * fStack_1ae4 * fStack_1a94;
    fVar362 = -fVar11 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * local_1ae8 * fStack_1a94;
    fVar52 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fVar233 *
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fStack_1a94;
    fVar61 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar65 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] * local_1a98;
    fVar233 = fVar144 * local_1af8 * local_1ae8 * local_1a98;
    fVar340 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar179 * local_1ab8 * local_1a98;
    fVar301 = fVar65 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[4] * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar112 = local_1ae8 * fVar17 * fStack_1a94;
    fVar133 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [4] * fVar49 * fStack_1a94;
    fVar134 = -fVar133;
    fVar49 = -fVar137 * local_1ab8 * local_1ae8 * local_1a98;
    fVar177 = fVar179 * local_1ab8 * local_1ae8;
    fVar377 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar177;
    fVar99 = local_1158 *
             v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [2];
    fVar113 = fVar23 * local_1ab8 * local_1ae8 * local_1a98;
    fVar227 = local_1ae8 * fVar326 * fStack_1a94;
    fVar326 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar249 * fStack_1a94;
    local_1158 = -fVar121;
    fVar28 = fVar28 * local_1a98;
    fVar191 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar234 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar39 = fVar39 * fStack_1a64;
    fVar272 = -fVar365 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar234 = fStack_1a64 * fVar295;
    fVar135 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar306;
    fVar114 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [1] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] * local_1af8 * fStack_1ae4 * fStack_1a94;
    fVar249 = fVar249 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1a94;
    fVar212 = fStack_1ae4 * fVar50 * local_1af8;
    fVar23 = local_1a98 * fVar212;
    fVar212 = fVar212 * fStack_1a64;
    fVar228 = local_1ae8 * fVar346 * fStack_1a94;
    fVar213 = local_1ae8 * fVar291 * fStack_1a64;
    fVar229 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a74 *
                    u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] * fStack_1a94;
    fVar291 = fStack_1a64 * local_1ae8 * fVar140;
    fVar136 = fStack_1a94 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar356 * local_1ab8;
    fVar128 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar140 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5];
    fVar115 = -(fVar140 *
               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [5]) * local_1a98;
    fVar116 = local_1ae8 * fVar66 * local_1af8 * fStack_1a94;
    fVar144 = fVar341 * local_1af8 * fStack_1ae4;
    fVar137 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar144;
    fVar117 = -fVar144 * local_1a98;
    fVar363 = fVar262 * fStack_1ab4 * local_1ae8 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar144 = -fVar118 * local_1a98;
    fVar193 = fVar232 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1ae4 * fStack_1a94;
    fVar346 = fVar346 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1a94;
    fVar178 = fVar50 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[5] * fStack_1ae4 * local_1a98;
    fVar189 = fVar339 * local_1968 * local_1ab8 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar365 = fVar365 * local_1a98;
    fVar295 = v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar295;
    fVar339 = fVar371 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar232 = -fVar306 * fStack_1a64;
    fVar262 = fVar316 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * fStack_1a94;
    fVar273 = fVar273 * local_1a98;
    fVar288 = local_1ae8 * fVar219 * fStack_1a94;
    fVar289 = -fVar288;
    fVar50 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [5] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * local_1af8 * fStack_1ae4 * fStack_1a94;
    fVar371 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar183 * fStack_1a94;
    fVar214 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar17 * fStack_1a94;
    fVar306 = fStack_1ae4 * fVar182 * local_1a98;
    fVar17 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar231 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] * fStack_1a94;
    fVar183 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar221 * fStack_1a94;
    fVar316 = -(local_1ae8 * fVar140) *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar219 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * fVar372 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar11 = u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [4] * fVar11 * local_1ae8 * fStack_1a94;
    fVar372 = fVar179 * fStack_1ab4 * local_1ae8 * local_1a98;
    fVar179 = fVar321 * local_1a98;
    fVar118 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[5] * fVar65 * local_1a98;
    fVar140 = fStack_1ae4 *
              local_1af8 *
              fVar19 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * fStack_1a94;
    fVar120 = fVar120 * local_1af8 * fStack_1ae4;
    fVar285 = fStack_1a94 * fVar66 * local_1ab8 * local_1ae8;
    fVar290 = local_1a98 * fVar120;
    fVar221 = fVar66 * fStack_1ab4 *
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fStack_1a94;
    fVar215 = -fVar120 * fStack_1a64;
    fVar120 = -(fVar16 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[5]) * local_1af8 * fStack_1ae4 * fStack_1a94;
    fVar231 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [5] * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0] * fStack_1ab4 * fStack_1ae4 * fStack_1a94;
    fVar216 = fVar341 * local_1ab8 * fStack_1ae4 * local_1a98;
    fVar330 = fVar330 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] * local_1a98;
    fVar217 = fVar341 * fStack_1ab4 * fStack_1ae4 *
              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0];
    fVar260 = fStack_1ab4 * fVar356 * local_1ae8 * fStack_1a94;
    factors.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
         fVar117 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
         fVar137 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         fVar217 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         -fVar216 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
         -fVar20 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
         fVar300 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar50 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
         fVar231 + v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar116 +
                   fVar90 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * -fVar221 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar285 +
                   fVar299 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar118 +
                   fVar115 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar128 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   fVar291 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar316 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] +
                   local_1418 * fStack_1a64 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * fVar235 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar219 +
                   -fVar206 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * -fVar38 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar213 +
                   fVar17 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * -fVar249 +
                   fVar326 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] +
                   fVar262 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   local_e38 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * fVar214 +
                   -fVar112 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] +
                   fVar366 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar114 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar278 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   -fVar339 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar234 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * -fVar295 +
                   fVar39 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                   fVar176 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar30 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[5] +
                   -fVar166 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   fVar84 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                   fVar178 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * -fVar212 +
                   fVar23 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[5] +
                   fVar64 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                   fVar193 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar63 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[5] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar28 +
                   local_d88 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   fVar361 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar113 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar107 +
                   fVar353 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar81 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                   fVar99 + v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * -fVar62 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar293 +
                            fVar80 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[2] +
                            fVar49 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[2] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar301 +
                            -fVar61 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            fVar34 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[4] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] * -fVar310 +
                            fVar52 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * -fVar111 +
                            fVar284 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar138 +
                            fVar322 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[4] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar347 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar110 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] * fVar35 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * fVar40 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * -fVar29 +
                            fVar351 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            fVar374 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            -fVar155 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                            fVar248 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar245 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[4] +
                            fVar93 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[2] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * fVar283 +
                            fVar261 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar79 +
                            -fVar198 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar174 +
                            fVar175 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            -fVar105 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                            fVar304 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[4] +
                            fVar173 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            fVar104 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar172 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            fVar18 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[4] +
                            -fVar202 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar15 +
                            fVar122 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            -fVar181 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] +
                            fVar312 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * -fVar208 +
                            fVar78 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[2] +
                            fVar325 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar170 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            fVar256 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar210 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1] +
                            -fVar279 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * -fVar194 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] * fVar103 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar209 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar255 +
                            fVar89 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[0] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * -fVar77 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] * fVar102 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] * -fVar165 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * fVar244 +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] * fVar311 +
                            fVar207 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            -fVar101 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                            fVar86 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] +
                            fVar85 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[2] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] * fVar254 +
                            fVar280 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[3] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * fVar236 +
                            -fVar98 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar247 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            fVar154 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[3] +
                            fVar31 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[0] +
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] * fVar83 +
                            -fVar297 *
                            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                            fVar164 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[3] +
                            fVar97 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] +
                            fVar224 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                            fVar368 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            fVar41 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[0] +
                            ((fVar156 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[2] +
                             fVar162 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                             fVar253 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[3] +
                             -fVar96 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[0] +
                             fVar323 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[0] +
                             fVar159 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                             ((fVar157 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[1] + (fVar94 - fVar367) + fVar294)
                             - fVar33 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[3])) -
                            fVar277 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1]);
    factors.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
         fVar161 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar74 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
         fVar260 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar330 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar21 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
         fVar362 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar371 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         fVar88 + v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar120 +
                  fVar129 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar215 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar290 +
                  fVar73 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar140 +
                  fVar179 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar289 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar136 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar372 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar191 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fStack_1a64 * fVar51 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar11 +
                  -fVar364 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar58 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar229 +
                  fVar183 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar92 +
                  fVar121 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -fVar273 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar320 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * -fVar306 +
                  fVar134 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar246 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar218 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar287 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar232 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar135 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar365 +
                  fVar272 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -fVar337 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar319 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar27 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  fVar125 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar189 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * -fVar228 +
                  -fVar346 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar119 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar144 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar302 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar363 +
                  fVar241 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar376 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  -fVar227 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar109 +
                  fVar91 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  fVar124 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar14 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar12 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar60 +
                  fVar123 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar377 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar340 +
                  fVar233 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar317 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar315 +
                  -fVar106 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar309 +
                  fVar352 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar180 +
                  fVar328 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar354 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar308 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar57 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar163 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar51 * local_1a98 +
                  -fVar259 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
                  fVar379 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar380 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar268 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar266 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar275 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * -fVar263 +
                  -(v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3] * fVar292) *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fStack_1a94 * fVar292 +
                  -fVar222 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar188 +
                  fVar335 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar22 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[1] +
                  fVar258 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar282 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar276 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -fVar139 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar56 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[3] +
                  -(fVar313 * local_1a68) *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fStack_1a94 * fVar313 +
                  local_1a68 * fVar148 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar243 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] +
                  -fVar53 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar257 +
                  fVar26 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] +
                  fVar72 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[1] +
                  fVar211 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar168 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  -fVar130 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
                  fVar132 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar318 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar296 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar281 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar271 +
                  fVar150 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar147 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * -(local_1a98 * fVar355) +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar226 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar265 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * -fVar36 +
                  fVar225 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar69 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  fVar127 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar126 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * -fVar100 +
                  -fVar357 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * local_1a68 * fVar270 +
                  fVar360 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar267 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar184 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] +
                  fVar55 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar314 +
                  fVar307 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar187 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar131 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar25 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar370 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar59 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  ((fVar185 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[1] +
                   fVar186 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar269 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   fVar160 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   fVar329 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   -fVar95 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[3] +
                   ((-fVar158 *
                     v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[2] +
                    ((((((((((((((fVar76 - fVar201) - fVar87) + fVar375) - fVar251) + fVar252 +
                             fVar190) - fVar334) + fVar205) - fVar331) - fVar324) + fVar195 +
                         fVar223 + fVar350) - fVar274) + fVar75 + fVar373 + fVar333 + fVar42 +
                       fVar204 + fVar43 + fVar44) - fVar359) - fVar32) + fVar45 + fVar46 + fVar153)
                   - v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[0] * fVar203 *
                     v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[4])) -
                  fVar286 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1]);
    factors.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
         -fVar54 * local_1a98 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
         v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         fVar54 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
         local_1ab8 * -(fVar19 * local_1968) * fStack_1ae4 * fStack_1a94 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
         fVar19 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fStack_1ab4 * fStack_1ae4 * fStack_1a94 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
         local_1ae8 * fVar356 * local_1af8 * fStack_1a94 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
         -(fVar356 * local_1af8) *
         v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         fStack_1a94 *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
         -(fVar192 *
          u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5])
         * local_1ae8 *
         v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
         local_1a98 *
         fVar192 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] *
         v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         -(fVar199 *
          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5])
         * local_1a98 +
         v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         fVar199 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         local_1ae8 * fVar199 * fStack_1a64 +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         -(local_1ae8 * fVar199) *
         v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] +
         fStack_1a64 *
         -(v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
          * fVar199) *
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         local_1a98 *
         v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] *
         fVar199 + -fVar327 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar303 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar16 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[5] * local_1ab8 * fStack_1ae4 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar355 * fStack_1a64 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -fVar378 *
                   u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * fStack_1ae4 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * -fVar270 * fStack_1a94 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   fStack_1ab4 *
                   -fVar230 *
                   u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * fStack_1ae4 * fStack_1a94 +
                   -fVar203 * fStack_1a64 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   fVar145 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[5] * fStack_1ae4 * fStack_1a94 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[5] * fVar151 * fStack_1a94 +
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar321 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   fVar237 * fStack_1ab4 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * local_1a98 +
                   fStack_1164 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar289 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar332 * local_1968 * local_1af8 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * fVar228 +
                   -fVar143 * fStack_1964 * fStack_1ab4 * local_1ae8 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar143 * local_1968 * local_1af8 * local_1ae8 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   -fVar344 * fStack_1a14 * fStack_1ab4 * local_1ae8 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -fVar264 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar177 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar344 * local_1a18 * fStack_1ab4 * local_1ae8 * local_1a98 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * fVar345 * local_1ae8 * fStack_1a94 +
                   fVar259 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   -fVar345 * fStack_1af4 * local_1ae8 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   -fVar220 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fStack_1a94 * fVar220 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] +
                   -fVar275 * local_1a68 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar263 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] * fVar292 * local_1a68 +
                   fVar242 * local_1ae8 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] +
                   fVar336 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   fVar71 * fStack_1ab4 * local_1ae8 * local_1a68 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar171 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] +
                   fVar121 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar142 * fStack_1a14 * local_1af8 * fStack_1ae4 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   -fVar142 * local_1a18 * local_1af8 * fStack_1ae4 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   fStack_1ae4 *
                   -fVar348 *
                   u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * fVar169 +
                   fStack_1af4 * fVar348 * fStack_1ae4 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   fVar182 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fVar348 * fStack_1ab4 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * -(fVar348 * fStack_1ab4) * fStack_1ae4 * local_1a98 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * fVar167 +
                   -(fVar67 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4]) * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar348 * local_1ab8 * fStack_1ae4 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] +
                   fVar134 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   -fVar197 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   fVar246 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   fStack_1ae4 * fVar197 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] +
                   fVar100 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * local_1a68 * fStack_1ae4 * fVar338 +
                   -fVar307 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * fVar59 +
                   fVar238 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * fVar95 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   fVar68 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] * fStack_1a94 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * -(local_1a68 * fVar151) +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   fVar237 * local_1ab8 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar332 * local_1af8 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fStack_1a94 +
                   fVar82 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -fVar143 * fStack_1964 * local_1ab8 * local_1ae8 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -fVar239 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar109 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar143 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] * local_1af8 * local_1ae8 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   fVar305 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   -fVar344 * fStack_1a14 * local_1ab8 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   -fVar349 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar196 +
                   fVar344 * local_1a18 * local_1ab8 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar380 +
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar242 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar188 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[3] +
                   fVar71 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[4] *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   fVar258 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   -fVar71 * fStack_1af4 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   -fVar313 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar71 * fStack_1ab4 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] +
                   fVar148 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[3] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fVar243 +
                   local_1a68 * fVar149 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   -fVar149 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] +
                   fVar72 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar132 +
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fVar348 * local_1ab8 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   fVar226 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[3] +
                   fVar338 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[3] * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   fVar360 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0] +
                   fVar141 * fStack_1a14 * local_1af8 * fStack_1ae4 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   -fVar141 * local_1a18 * local_1af8 * fStack_1ae4 * local_1a98 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * -fVar342 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   -fVar24 * u3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[4] * fStack_1ae4 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar185 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] *
                   fVar24 * fStack_1af4 * fStack_1ae4 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   fVar70 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] *
                   fStack_1ae4 * fVar238 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   -(fVar24 * local_1ab8) *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] *
                   -(v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[3] * fVar343) * local_1a98 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fVar152 +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] *
                   fStack_1ae4 * fVar24 * local_1ab8 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   -fVar358 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fVar68 * fStack_1ae4 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4] * fVar250 * fStack_1a94 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
                   -fVar146 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] * fVar200 +
                   -fVar250 * fStack_1ae4 * local_1a68 *
                   v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
    factors.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
         fVar161 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar74 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
         fVar260 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar330 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar21 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
         fVar362 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2] +
         fVar371 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] *
         fVar88 + v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar120 +
                  fVar129 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar215 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar290 +
                  fVar73 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar140 +
                  -fVar179 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar288 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar136 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar372 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar191 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fStack_1a64 * fVar51 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * -fVar11 +
                  fVar364 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * -fVar58 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar229 +
                  fVar183 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar92 +
                  local_1158 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar273 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -fVar320 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar306 +
                  fVar133 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -fVar246 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar218 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar287 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar232 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] * fVar135 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar365 +
                  fVar272 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar337 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar319 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  -fVar27 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  -fVar125 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
                  fVar189 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar228 +
                  fVar346 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar119 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar144 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar302 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar363 +
                  -fVar241 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar376 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar227 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar108 +
                  fVar91 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  -fVar124 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar14 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar12 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar60 +
                  -fVar123 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fVar377 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar340 +
                  fVar233 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar317 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar315 +
                  fVar106 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar309 +
                  fVar352 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar180 +
                  fVar328 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar354 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar308 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar57 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar163 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * fVar51 * local_1a98 +
                  fVar259 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  -fVar379 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] +
                  -fVar380 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                  fVar268 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar266 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  -(v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[3] * fVar275) *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar263 +
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar292 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * -(fStack_1a94 * fVar292) +
                  fVar222 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * -fVar188 +
                  fVar336 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  -fVar22 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar298 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar282 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar276 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar139 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar171 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[3] +
                  fVar313 * local_1a68 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] * -(fStack_1a94 * fVar313) +
                  -(local_1a68 * fVar148) *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  fStack_1a94 * fVar148 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] +
                  fVar53 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar257 +
                  -fVar26 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  -fVar72 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  fVar211 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar169 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar130 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar369 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar318 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] * fVar296 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * fVar281 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * fVar167 +
                  -fVar150 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[2] * -fVar147 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] * local_1a98 * fVar355 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[4] *
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar355 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * -fVar265 +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar36 +
                  fVar225 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[2] +
                  fVar69 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  fVar127 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                  fVar126 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar100 +
                  fVar357 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1] +
                  (((fVar267 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                    fVar184 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[3] +
                    fVar55 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                    fVar314 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] +
                    (((fVar131 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                      fVar25 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1] +
                      fVar370 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[2] +
                      fVar59 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] +
                      fVar286 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1] +
                      ((fVar186 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                       fVar269 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                       (((fVar95 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[3] +
                         v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] * fVar203 *
                         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4] +
                         fVar158 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                         ((((((((((((((((fVar87 + (fVar201 - fVar76)) - fVar375) + fVar251) -
                                     fVar252) - fVar190) + fVar334) - fVar205) + fVar331 + fVar324)
                                - fVar195) + fVar223 + fVar350 + fVar274) - fVar75) + fVar373 +
                              fVar333 + fVar42 + fVar204) - fVar43) - fVar44) + fVar359 + fVar32 +
                           fVar45 + fVar46) - fVar153)) -
                        fVar329 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2]) -
                       fVar160 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2])) -
                      fVar185 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[1])) -
                     fVar187 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1]) -
                    fVar307 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0])) -
                   fVar360 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[1]) -
                  local_1a68 * fVar270 *
                  v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]);
    factors.super_PlainObjectBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
         fVar117 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
         fVar137 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1] +
         ((fVar216 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[2] +
          fVar20 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] +
          fVar300 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[2] +
          ((fVar231 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] +
           fVar116 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[0] +
           fVar90 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[1] +
           fVar221 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[2] +
           ((fVar299 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[2] +
            fVar118 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[2] +
            fVar115 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] +
            fVar128 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[1] +
            fVar291 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] +
            fVar316 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[5] +
            local_1418 * fStack_1a64 *
            v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
            + fVar235 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[5] +
              ((fVar206 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[2] +
               fVar38 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2] +
               (((fVar249 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[0] +
                 ((fVar262 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                  fVar37 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[2] +
                  ((fVar112 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5] +
                   fVar366 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[2] +
                   ((fVar278 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                    fVar339 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                    ((fVar295 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[5] +
                     fVar39 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                     fVar176 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2] +
                     fVar30 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[5] +
                     fVar166 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[1] +
                     fVar84 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[2] +
                     ((fVar212 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] +
                      ((fVar64 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                       fVar193 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[2] +
                       fVar63 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[5] +
                       ((fVar240 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] +
                        fVar361 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                        fVar113 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                        fVar107 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                        ((fVar81 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1] +
                         fVar13 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2] +
                         fVar62 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] +
                         ((fVar80 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[2] +
                          fVar49 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[2] +
                          ((fVar61 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] +
                           ((fVar310 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4] +
                            fVar52 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[1] +
                            fVar111 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                            ((fVar138 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[2] +
                             fVar322 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[4] +
                             fVar347 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                             fVar110 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1] +
                             fVar35 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[4] +
                             fVar40 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[0] +
                             fVar29 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[2] +
                             fVar351 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[1] +
                             ((fVar155 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[1] +
                              fVar248 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[2] +
                              fVar245 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[4] +
                              fVar93 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2] +
                              fVar283 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[0] +
                              fVar261 * v3.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[0] +
                              ((fVar198 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[2] +
                               ((fVar175 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                fVar105 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[2] +
                                ((fVar173 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[1] +
                                 ((fVar172 * v3.
                                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[1] +
                                  fVar18 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[4] +
                                  fVar202 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[1] +
                                  fVar15 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[1] +
                                  ((fVar181 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[4] +
                                   ((fVar208 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[1] +
                                    fVar78 * v3.
                                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[2] +
                                    fVar325 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[2] +
                                    fVar170 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[0] +
                                    ((fVar210 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[1] +
                                     fVar279 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[2] +
                                     fVar194 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[0] +
                                     ((fVar209 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[2] +
                                      fVar255 * v3.
                                                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                .m_storage.m_data.array[2] +
                                      ((fVar77 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[0] +
                                       ((fVar165 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                        fVar244 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                        fVar311 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                        fVar207 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                        fVar101 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                        ((fVar85 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                         fVar254 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                         fVar280 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                         fVar236 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                         fVar98 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                         fVar247 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                         fVar154 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                         ((fVar83 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                          fVar297 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                          ((fVar97 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                           ((fVar368 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                            ((fVar277 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                             fVar156 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                             fVar162 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2] +
                                             fVar253 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                             fVar96 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                             fVar323 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0] +
                                             ((fVar33 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3] +
                                              fVar157 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[1] +
                                              (fVar367 - fVar94) + fVar294) -
                                             fVar159 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) -
                                            fVar41 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0])) -
                                           fVar224 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[2])) -
                                          fVar164 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[3])) -
                                         fVar31 * v3.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                  .m_storage.m_data.array[0])) -
                                        fVar86 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[1])) -
                                       fVar102 * v3.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array[3])) -
                                      fVar89 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[0])) -
                                     fVar103 * v3.
                                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                               .m_storage.m_data.array[1])) -
                                    fVar256 * v3.
                                              super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array[2])) -
                                   fVar312 * v3.
                                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[0])) -
                                  fVar122 * v3.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                            .m_storage.m_data.array[2])) -
                                 fVar104 * v3.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[2])) -
                                fVar304 * v3.
                                          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[4])) -
                               fVar174 * v3.
                                         super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                         .m_storage.m_data.array[1])) -
                              fVar79 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[2])) -
                             fVar374 * v3.
                                       super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                       m_storage.m_data.array[0])) -
                            fVar284 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[1])) -
                           v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[4] * fVar34)) -
                          fVar301 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[1])) -
                         fVar293 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[1])) -
                        fVar353 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[2])) -
                       fVar28 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[0])) -
                      fVar23 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5])) -
                     fVar178 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[2])) -
                    fVar234 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0])) -
                   fVar114 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                             m_storage.m_data.array[0])) -
                  fVar214 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                            .m_data.array[1])) -
                 fVar326 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[5])) -
                fVar17 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2]) -
               fVar213 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[2])) -
              fVar219 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[2])) -
           fVar285 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[2])) -
          fVar50 * v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[1])) -
         v3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] *
         fVar217);
    o4_roots<float>(&realRoots,&factors);
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar10 = (ulong)((long)realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
      fVar11 = realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      auVar47._0_4_ = 1.0 - fVar11 * fVar11;
      fVar12 = fVar11 * fVar11 + 1.0;
      auVar47._4_4_ = fVar11 + fVar11;
      auVar47._8_8_ = 0;
      auVar48._4_4_ = fVar12;
      auVar48._0_4_ = fVar12;
      auVar48._8_4_ = fVar12;
      auVar48._12_4_ = fVar12;
      auVar48 = divps(auVar47,auVar48);
      local_139c = auVar48._0_4_;
      fVar41 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [2] * local_139c;
      b = auVar48._4_4_;
      fVar40 = fStack_1964 *
               local_139c *
               -u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0];
      fVar72 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * fVar40;
      fVar36 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar41;
      fVar27 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * -local_139c * fStack_1964 *
               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
      fVar22 = fStack_1964 *
               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * local_139c;
      fVar32 = -fVar22 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4];
      fVar320 = local_1968 * fVar41;
      fVar29 = -local_139c *
               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4] * fStack_1964 * local_1ae8;
      fVar40 = fVar40 * fStack_1ae4;
      fVar19 = fStack_1964 *
               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * b;
      fVar23 = -fVar19 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[4];
      fVar333 = fStack_1964 *
                u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[1] * b;
      fVar30 = v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * fVar333;
      fVar34 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [2] * b;
      fVar24 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar34;
      fVar190 = local_1968 * -fVar34;
      fVar35 = -fVar34 * fStack_1a14;
      local_13a4 = -b;
      fVar25 = local_13a4 *
               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * fStack_1964 * local_1ae8;
      fVar31 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [4] * b * fStack_1964 *
               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
      fVar333 = fVar333 * fStack_1ae4;
      fVar15 = b * local_139c;
      transOut.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
           = local_139c;
      fVar42 = local_139c * local_139c;
      fVar11 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar42;
      fVar263 = fStack_1ae4 * local_1968 * fVar11;
      fVar12 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * fVar42;
      fVar195 = b * b;
      fVar13 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar195;
      fVar14 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * fVar195;
      fVar304 = fStack_1ae4 *
                u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * fVar14;
      fVar16 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar15;
      fVar366 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[0] * fVar16;
      fVar37 = local_1968 * fVar16;
      fVar75 = -fVar16 * local_1a18 * fStack_1ae4;
      fVar319 = fStack_1a14 * fVar16 * fStack_1ae4;
      fVar16 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [1] * fVar15;
      fVar38 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar16;
      fVar17 = local_1a18 * fVar16 * fStack_1ae4;
      fVar39 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[3] * fVar15;
      fVar33 = u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * fVar15 * local_1968;
      fVar18 = u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar15 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4];
      fVar26 = local_1968 * fVar16;
      fVar223 = fVar16 * fStack_1a14 * fStack_1ae4;
      fVar15 = -(fVar15 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[4]) * local_1968;
      fVar22 = fVar22 * fStack_1ae4;
      fVar19 = fVar19 * fStack_1ae4;
      fVar16 = ((((fVar36 * local_1ae8 * fStack_1a94 +
                  fVar22 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] +
                  fVar40 * local_1a98 +
                  (v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0] * fVar65 * local_1a98 -
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0] * fVar65 * local_1ae8)) -
                 v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] * fVar320 * fStack_1a94) +
                fVar19 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0]) -
               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0] * fVar24 * fStack_1a94) + fVar333 * local_1a98 +
               fVar190 * local_1ae8 * fStack_1a94 + fVar263 * fStack_1a94;
      fVar274 = -fVar12 * u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fStack_1ae4;
      fVar20 = local_1968 * fVar13 * fStack_1ae4;
      fVar317 = fVar20 * fStack_1a94;
      fVar21 = fVar304 * fStack_1a94;
      tx = -(local_1ae8 * fVar15 * fStack_1a94 +
            fVar223 * local_1a98 +
            ((fStack_1ae4 * fVar26 * local_1a68 +
             (((local_1ae8 * fVar39 * fStack_1a94 +
               fVar17 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] +
               ((fStack_1ae4 * fVar38 *
                 v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] +
                fVar319 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] +
                fVar75 * local_1a98 +
                ((fStack_1ae4 * fVar37 *
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] +
                 v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[4] * fVar366 * fStack_1a94 +
                 -fVar366 * fStack_1ae4 * local_1a68 +
                 local_1968 *
                 fVar195 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[4] *
                 v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[0] * fStack_1a94 +
                 (((local_1a18 * fVar14 * fStack_1ae4 * local_1a98 +
                   local_1968 * fVar14 *
                   v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3] * fStack_1a94 +
                   ((fVar304 * local_1a68 +
                    ((u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] *
                      fVar42 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[4] * local_1ae8 * fStack_1a94 +
                     v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[4] *
                     u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data
                     .array[0] * fVar12 * fStack_1a94 +
                     (((u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
                        u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] * fVar42 *
                        v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1a94 +
                       ((u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] * fVar11 *
                         v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3] * fStack_1a94 +
                        (((v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[5] * fVar190 * fStack_1a94 +
                          u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[1] * b *
                          u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[5] * fStack_1ae4 * fStack_1a94 +
                          fVar333 * fStack_1a64 +
                          fVar31 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          fVar25 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar35 *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * local_1a18 * fVar34 * local_1a98 +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar190 *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar24 * local_1a68 +
                          fVar30 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          fVar23 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] *
                          u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[5] * local_139c * fStack_1ae4 * fStack_1a94 +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[5] * fVar36 * fStack_1a94 +
                          local_139c *
                          -u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] *
                          u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[5] * fStack_1ae4 * fStack_1a94 +
                          fVar40 * fStack_1a64 +
                          fVar29 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar41 * fStack_1a14 * local_1a98 +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar320 * local_1a68 +
                          fVar32 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          fVar27 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * local_1a18 * fVar41 *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar36 *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] +
                          fVar72 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                          -fVar341 * fStack_1ae4 *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] +
                          fVar66 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] * fStack_1a94 +
                          v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * fVar65 * fStack_1a64 +
                          -fVar65 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array[5] *
                          v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0]) -
                         local_1968 *
                         u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[5] * b * fStack_1ae4 * fStack_1a94) -
                        fStack_1ae4 *
                        u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fVar11 *
                        v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3])) -
                       local_1a18 * fVar11 * fStack_1ae4 *
                       v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0])) - fVar263 * local_1a68) -
                     fVar11 * fStack_1a14 * fStack_1ae4 * local_1a98)) -
                    v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[4] * local_1968 * fVar13 * fStack_1a94)) -
                   fStack_1ae4 * local_1968 * fVar14 *
                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[3])) -
                  fVar14 * fStack_1a14 * fStack_1ae4 *
                  v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0]) -
                 local_1968 *
                 u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array[3] * fVar195 * local_1ae8 * fStack_1a94)) -
                v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array[3] * fVar37 * fStack_1a94)) -
               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] * fVar38 * fStack_1a94)) -
              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
              [0] * fVar33 * fStack_1a94) -
             v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             [0] * fVar18 * fStack_1a94)) -
            v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
            * fVar26 * fStack_1a94)) /
           (((fVar16 - u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                       m_data.array[0] * fVar12 * fStack_1ae4 * fStack_1a94) + fVar317) - fVar21);
      ty = -(fVar15 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] * fStack_1a94 +
            fVar18 * local_1ae8 * fStack_1a94 +
            fVar33 * local_1ae8 * fStack_1a94 +
            fVar223 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[0] +
            (((fStack_1ae4 * fVar26 *
               v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [3] + fVar38 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] * fStack_1a94 +
                     (((fVar37 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[4] * fStack_1a94 +
                       ((fVar39 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[0] * fStack_1a94 +
                        fVar75 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                        fVar366 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3] * fStack_1a94 +
                        -fVar366 * fStack_1ae4 *
                        v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[3] +
                        ((u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[3] * fVar195 *
                          u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                          m_data.array[0] * local_1ae8 * fStack_1a94 +
                         ((fVar13 * fStack_1a14 * fStack_1ae4 *
                           v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] +
                          ((fVar20 * v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array[3] +
                           u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] * fVar13 *
                           v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[4] * fStack_1a94 +
                           ((fVar42 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                      .m_storage.m_data.array[4] * local_1968 * local_1ae8 *
                             fStack_1a94 +
                            ((local_1968 * fVar12 *
                              v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[4] * fStack_1a94 +
                             ((u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] * fVar42 * local_1968 *
                               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] * fStack_1a94 +
                              ((fVar274 * v2.
                                          super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                          .m_storage.m_data.array[3] +
                               local_1968 * fVar11 *
                               v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3] * fStack_1a94 +
                               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5] * b *
                               u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] * fStack_1ae4 * fStack_1a94 +
                               fVar24 * v1.
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                        m_storage.m_data.array[5] * fStack_1a94 +
                               (((fVar31 * local_1a98 +
                                 fVar25 * local_1a98 +
                                 fVar35 * local_1ae8 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[0] +
                                 local_1a18 * fVar34 * local_1ae8 * local_1a98 +
                                 fVar190 * local_1ae8 *
                                 v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3] +
                                 local_1ae8 * fVar24 * local_1a68 +
                                 fVar30 * local_1a98 +
                                 fVar23 * local_1a98 +
                                 u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] * local_139c * local_1968 * fStack_1ae4 *
                                 fStack_1a94 +
                                 fVar320 * v1.
                                           super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                           .m_storage.m_data.array[5] * fStack_1a94 +
                                 (((fVar29 * local_1a98 +
                                   fVar41 * fStack_1a14 * local_1ae8 * local_1a98 +
                                   local_1ae8 * fVar320 * local_1a68 +
                                   fVar32 * local_1a98 +
                                   fVar27 * local_1a98 +
                                   local_1a18 * fVar41 * local_1ae8 *
                                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[0] +
                                   fVar36 * local_1ae8 *
                                   v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array[3] +
                                   fVar72 * local_1a98 +
                                   -fVar341 * fStack_1ae4 * local_1a98 +
                                   local_1ae8 * fVar66 * fStack_1a94 +
                                   fVar65 * local_1ae8 * fStack_1a64 +
                                   -fVar65 * v1.
                                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>
                                             .m_storage.m_data.array[5] * local_1a98) -
                                  fVar22 * fStack_1a64) -
                                 u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[1] * local_139c *
                                 u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5] * fStack_1ae4 * fStack_1a94)) -
                                fVar19 * fStack_1a64) -
                               u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[0] * b *
                               u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5] * fStack_1ae4 * fStack_1a94)) -
                              local_1a18 * fVar12 * fStack_1ae4 *
                              v2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                              m_storage.m_data.array[0])) -
                             fStack_1ae4 * local_1968 * fVar12 * local_1a68)) -
                            fVar12 * fStack_1a14 * fStack_1ae4 * local_1a98)) -
                           fStack_1ae4 *
                           u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array[0] * fVar13 * local_1a68)) -
                          local_1a18 * fVar13 * fStack_1ae4 * local_1a98)) -
                         u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[0] * fVar14 *
                         v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[3] * fStack_1a94)) -
                        fVar195 * u1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[4] *
                        u2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] *
                        v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[0] * fStack_1a94)) - fStack_1ae4 * fVar37 * local_1a68)) -
                      fVar319 * local_1a98) - fStack_1ae4 * fVar38 * local_1a68)) -
             fVar26 * v1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array[3] * fStack_1a94) - fVar17 * local_1a98)) /
           ((fVar274 * fStack_1a94 + fVar16 + fVar317) - fVar21);
      local_af8._8_8_ = 0;
      realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      local_af8._16_8_ = 1;
      local_af8._24_8_ = (XprTypeNested)0x1;
      local_af8._0_8_ = &transOut;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_af8,
                          &local_13a4);
      local_13a8 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13a8);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar7,&tx);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar7,&b);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_139c);
      local_13ac = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13ac);
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar7,&ty);
      local_13b0 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13b0);
      local_13b4 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13b4);
      local_13b8 = 1.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13b8);
      local_13bc = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13bc);
      local_13c0 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13c0);
      local_13c4 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13c4);
      local_13c8 = 0.0;
      pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar7,&local_13c8);
      local_13cc = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_(pCVar7,&local_13cc);
      Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::finished
                ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_af8);
      local_af8._0_8_ = &TV;
      local_af8._16_8_ = &TU;
      local_af8._8_8_ = &transOut;
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                (&transOut,
                 (Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
                  *)local_af8);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,&transOut);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&realRoots.super__Vector_base<float,_std::allocator<float>_>);
    std::
    _Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~_Vector_base(&local_128);
    return __return_storage_ptr__;
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,
                           "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
  std::endl<char,std::char_traits<char>>(poVar8);
  exit(-1);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}